

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *window;
  
  pIVar1 = GImGui;
  GImGui->NavLayer = layer;
  window = pIVar1->NavWindow;
  if (layer == ImGuiNavLayer_Main) {
    window = ImGui::NavRestoreLastChildNavWindow(window);
    pIVar1->NavWindow = window;
  }
  if (window->NavLastIds[layer] != 0) {
    ImGui::SetNavIDWithRectRel(window->NavLastIds[layer],layer,0,window->NavRectRel + layer);
    return;
  }
  ImGui::NavInitWindow(window,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[layer], layer, 0, g.NavWindow->NavRectRel[layer]);
    else
        ImGui::NavInitWindow(window, true);
}